

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  u8 uVar4;
  int iVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  uint *puVar9;
  u8 *puVar10;
  CellInfo info;
  CellInfo local_48;
  u8 uVar5;
  u8 uVar6;
  
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar2 = *(uint *)pPage->aData;
    if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      return 0;
    }
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x113af,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    return 0xb;
  }
  iVar7 = 0;
  if (pPage->isInit == '\0') {
    iVar7 = btreeInitPage(pPage);
  }
  uVar8 = 0;
  bVar3 = false;
  if (iVar7 == 0) {
    uVar1 = pPage->nCell;
    if (uVar1 != 0) {
      uVar8 = 0;
      do {
        puVar9 = (uint *)(pPage->aData +
                         (CONCAT11(pPage->aCellIdx[uVar8 * 2],pPage->aCellIdx[uVar8 * 2 + 1]) &
                         pPage->maskPage));
        uVar4 = (u8)(iTo >> 0x18);
        uVar5 = (u8)(iTo >> 0x10);
        uVar6 = (u8)(iTo >> 8);
        if (eType == '\x03') {
          (*pPage->xParseCell)(pPage,(u8 *)puVar9,&local_48);
          iVar7 = 0;
          if (local_48.nLocal < local_48.nPayload) {
            puVar10 = (u8 *)((long)puVar9 + (ulong)local_48.nSize);
            if (pPage->aData + pPage->pBt->usableSize < puVar10) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x113c2,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              iVar7 = 1;
            }
            else {
              uVar2 = *(uint *)(puVar10 + -4);
              if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
                  == iFrom) {
                puVar10[-4] = uVar4;
                puVar10[-3] = uVar5;
                puVar10[-2] = uVar6;
                puVar10[-1] = (u8)iTo;
                iVar7 = 2;
              }
            }
          }
        }
        else {
          uVar2 = *puVar9;
          iVar7 = 0;
          if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
              iFrom) {
            *(u8 *)puVar9 = uVar4;
            *(u8 *)((long)puVar9 + 1) = uVar5;
            *(u8 *)((long)puVar9 + 2) = uVar6;
            *(u8 *)((long)puVar9 + 3) = (u8)iTo;
            iVar7 = 2;
          }
        }
        if (iVar7 != 0) {
          if (iVar7 == 2) goto LAB_00134d47;
          iVar7 = 0xb;
          bVar3 = false;
          goto LAB_00134b94;
        }
        uVar8 = uVar8 + 1;
      } while ((uint)uVar1 != uVar8);
      uVar8 = (ulong)(uint)uVar1;
    }
LAB_00134d47:
    iVar7 = 0xb;
    bVar3 = true;
    if ((uint)uVar8 == (uint)uVar1) {
      if (eType == '\x05') {
        uVar2 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
        if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
            iFrom) {
          *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
               iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
          goto LAB_00134b94;
        }
      }
      bVar3 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x113d4,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    }
  }
LAB_00134b94:
  if (bVar3) {
    return 0;
  }
  return iVar7;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_PAGE(pPage);
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }

    if( i==nCell ){
      if( eType!=PTRMAP_BTREE ||
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}